

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harris.cpp
# Opt level: O1

Harris * __thiscall Harris::MeanFilter(Harris *this,Mat *intImg,int range)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  int in_ECX;
  long lVar6;
  undefined4 in_register_00000014;
  long lVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  long lVar14;
  
  lVar7 = CONCAT44(in_register_00000014,range);
  cv::Mat::Mat(&this->harrisResponses,*(int *)(lVar7 + 8) + in_ECX * -2,
               *(int *)(lVar7 + 0xc) + in_ECX * -2,5);
  lVar6 = (long)in_ECX;
  lVar5 = *(int *)(lVar7 + 8) - lVar6;
  if (in_ECX < (int)lVar5) {
    iVar1 = *(int *)(lVar7 + 0xc);
    lVar2 = *(long *)(lVar7 + 0x10);
    plVar3 = *(long **)(lVar7 + 0x48);
    lVar7 = *(long *)&this->field_0x10;
    plVar4 = *(long **)&this->field_0x48;
    lVar10 = lVar6 * 2;
    lVar14 = 0;
    lVar11 = lVar6;
    do {
      if (in_ECX < iVar1 - in_ECX) {
        pfVar9 = (float *)(*plVar3 * lVar14 + lVar2);
        pfVar12 = (float *)(*plVar3 * lVar10 + lVar2);
        pfVar13 = (float *)(*plVar4 * lVar14 + lVar7);
        lVar8 = (long)iVar1 + lVar6 * -2;
        do {
          *pfVar13 = ((pfVar12[lVar6 * 2] + *pfVar9) - *pfVar12) - pfVar9[lVar6 * 2];
          pfVar9 = pfVar9 + 1;
          pfVar12 = pfVar12 + 1;
          pfVar13 = pfVar13 + 1;
          lVar8 = lVar8 + -1;
        } while (lVar8 != 0);
      }
      lVar11 = lVar11 + 1;
      lVar14 = lVar14 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar11 != lVar5);
  }
  return this;
}

Assistant:

Mat Harris::MeanFilter(Mat& intImg, int range) {
    Mat medianFilteredMat(intImg.rows-range*2, intImg.cols-range*2, CV_32F);

    for (int r = range; r < intImg.rows-range; r++) {
        for (int c = range; c < intImg.cols-range; c++) {
            medianFilteredMat.at<float>(r-range, c-range) = 
                intImg.at<float>(r+range, c+range)
                + intImg.at<float>(r-range, c-range)
                - intImg.at<float>(r+range, c-range)
                - intImg.at<float>(r-range, c+range);
        }
    }

    return medianFilteredMat;
}